

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O1

int find_branch(char *s,proto_dungeon *pd)

{
  char cVar1;
  uint uVar2;
  branch **ppbVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  branch *pbVar7;
  tmpbranch *__s1;
  
  if (pd == (proto_dungeon *)0x0) {
    uVar5 = 0xffffffff;
    pbVar7 = branches;
    if (branches != (branch *)0x0) {
      do {
        cVar1 = (pbVar7->end2).dnum;
        iVar4 = strncasecmp(dungeons[cVar1].dname,s,0xffffffffffffffff);
        if ((iVar4 == 0) ||
           ((iVar4 = strncasecmp(dungeons[cVar1].dname,"The ",4), iVar4 == 0 &&
            (iVar4 = strncasecmp(dungeons[cVar1].dname + 4,s,0xffffffffffffffff), iVar4 == 0)))) {
          return (int)(char)((pbVar7->end2).dlevel + (char)dungeons[cVar1].ledger_start) |
                 (int)(char)((pbVar7->end1).dlevel +
                            (char)dungeons[(pbVar7->end1).dnum].ledger_start) << 8;
        }
        ppbVar3 = &pbVar7->next;
        pbVar7 = *ppbVar3;
      } while (*ppbVar3 != (branch *)0x0);
    }
  }
  else {
    uVar2 = pd->n_brs;
    if ((int)uVar2 < 1) {
      uVar6 = 0;
    }
    else {
      __s1 = pd->tmpbranch;
      uVar6 = 0;
      do {
        iVar4 = strcmp(__s1->name,s);
        if (iVar4 == 0) goto LAB_0018cb26;
        uVar6 = uVar6 + 1;
        __s1 = __s1 + 1;
      } while (uVar2 != uVar6);
      uVar6 = (ulong)uVar2;
    }
LAB_0018cb26:
    uVar5 = (uint)uVar6;
    if (uVar5 == uVar2) {
      panic("find_branch: can\'t find %s",s);
    }
  }
  return uVar5;
}

Assistant:

static int find_branch(const char *s, /* dungeon name */
		       struct proto_dungeon *pd)
{
	int i;

	if (pd) {
	    for (i = 0; i < pd->n_brs; i++)
		if (!strcmp(pd->tmpbranch[i].name, s)) break;
	    if (i == pd->n_brs) panic("find_branch: can't find %s", s);
	} else {
	    /* support for level tport by name */
	    branch *br;
	    const char *dnam;

	    for (br = branches; br; br = br->next) {
		dnam = dungeons[br->end2.dnum].dname;
		if (!strcmpi(dnam, s) ||
			(!strncmpi(dnam, "The ", 4) && !strcmpi(dnam + 4, s)))
		    break;
	    }
	    i = br ? ((ledger_no(&br->end1) << 8) | ledger_no(&br->end2)) : -1;
	}
	return i;
}